

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_set_restricted(Integer g_a,Integer *list,Integer size)

{
  long icode;
  global_array_t *pgVar1;
  C_Integer *pCVar2;
  uint uVar3;
  long lVar4;
  C_Integer CVar5;
  long lVar6;
  long lVar7;
  C_Integer CVar8;
  Integer local_48;
  
  pgVar1 = GA;
  lVar6 = g_a + 1000;
  GA[lVar6].num_rstrctd = size;
  pCVar2 = (C_Integer *)malloc(size * 8);
  pgVar1[lVar6].rstrctd_list = pCVar2;
  local_48 = GAnproc;
  pCVar2 = (C_Integer *)malloc(GAnproc * 8);
  GA[lVar6].rank_rstrctd = pCVar2;
  uVar3 = GA[lVar6].p_handle;
  if (GA[lVar6].p_handle == 0xfffffffe) {
    uVar3 = GA_Default_Proc_Group;
  }
  lVar7 = GAme;
  if (0 < (int)uVar3) {
    local_48 = (Integer)PGRP_LIST[uVar3].map_nproc;
    lVar7 = (long)PGRP_LIST[uVar3].map_proc_list[GAme];
  }
  if (0 < GAnproc) {
    pCVar2 = GA[lVar6].rank_rstrctd;
    lVar4 = 0;
    do {
      pCVar2[lVar4] = -1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < GAnproc);
  }
  if (size < 1) {
    CVar8 = 0;
    CVar5 = 0;
  }
  else {
    lVar4 = 0;
    CVar5 = 0;
    CVar8 = 0;
    do {
      GA[lVar6].rstrctd_list[lVar4] = list[lVar4];
      icode = list[lVar4];
      if (lVar7 == icode) {
        CVar5 = 1;
        CVar8 = lVar4;
      }
      if ((icode < 0) || (local_48 <= icode)) {
        pnga_error("Invalid processor in list",icode);
      }
      GA[lVar6].rank_rstrctd[list[lVar4]] = lVar4;
      lVar4 = lVar4 + 1;
    } while (size != lVar4);
  }
  pgVar1 = GA;
  GA[lVar6].has_data = CVar5;
  pgVar1[lVar6].rstrctd_id = CVar8;
  return;
}

Assistant:

void pnga_set_restricted(Integer g_a, Integer *list, Integer size)
{
  Integer i, ig, id=0, me, p_handle, has_data, nproc;
  Integer ga_handle = g_a + GA_OFFSET;
  GA[ga_handle].num_rstrctd = size;
  GA[ga_handle].rstrctd_list = (Integer*)malloc(size*sizeof(Integer));
  GA[ga_handle].rank_rstrctd = (Integer*)malloc((GAnproc)*sizeof(Integer));
  p_handle = GA[ga_handle].p_handle;
  if (p_handle == -2) p_handle = pnga_pgroup_get_default();
  if (p_handle > 0) {
    me = PGRP_LIST[p_handle].map_proc_list[GAme];
    nproc = PGRP_LIST[p_handle].map_nproc;
  } else {
    me = GAme;
    nproc = GAnproc;
  }
  has_data = 0;

  for (i=0; i<GAnproc; i++) {
    GA[ga_handle].rank_rstrctd[i] = -1;
  }

  for (i=0; i<size; i++) {
    GA[ga_handle].rstrctd_list[i] = list[i];
    /* check if processor is in list */
    if (me == list[i]) {
      has_data = 1;
      id = i;
    }
    /* check if processor is in group */
    if (list[i] < 0 || list[i] >= nproc)
      pnga_error("Invalid processor in list",list[i]);
    ig = list[i];
    GA[ga_handle].rank_rstrctd[ig] = i;
  }
  GA[ga_handle].has_data = has_data;
  GA[ga_handle].rstrctd_id = id;
}